

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagger.cpp
# Opt level: O2

char * __thiscall
MeCab::anon_unknown_0::LatticeImpl::toStringInternal(LatticeImpl *this,Node *node,StringBuffer *os)

{
  bool bVar1;
  StringBuffer *this_00;
  StringBuffer *in_RCX;
  void *extraout_RDX;
  void *__buf;
  void *__buf_00;
  void *extraout_RDX_00;
  void *__buf_01;
  char *pcVar2;
  
  os->size_ = 0;
  if (node == (Node *)0x0) {
    pcVar2 = "node is NULL";
  }
  else {
    if (this->writer_ == (Writer *)0x0) {
      StringBuffer::write(os,(int)node->surface,(void *)(ulong)node->length,(size_t)in_RCX);
      this_00 = (StringBuffer *)StringBuffer::write(os,9,__buf,(size_t)in_RCX);
      StringBuffer::write(this_00,(int)node->feature,__buf_00,(size_t)in_RCX);
      __buf_01 = extraout_RDX_00;
    }
    else {
      in_RCX = os;
      bVar1 = Writer::writeNode(this->writer_,&this->super_Lattice,node,os);
      __buf_01 = extraout_RDX;
      if (!bVar1) {
        return (char *)0x0;
      }
    }
    StringBuffer::write(os,0,__buf_01,(size_t)in_RCX);
    if ((os->ptr_ == (char *)0x0 | os->error_) != 1) {
      return os->ptr_;
    }
    pcVar2 = "output buffer overflow";
  }
  (*(this->super_Lattice)._vptr_Lattice[0x25])(this,pcVar2);
  return (char *)0x0;
}

Assistant:

const char *LatticeImpl::toStringInternal(const Node *node,
                                          StringBuffer *os) {
  os->clear();
  if (!node) {
    set_what("node is NULL");
    return 0;
  }
  if (writer_) {
    if (!writer_->writeNode(this, node, os)) {
      return 0;
    }
  } else {
    os->write(node->surface, node->length);
    *os << '\t' << node->feature;
  }
  *os << '\0';
  if (!os->str()) {
    set_what("output buffer overflow");
    return 0;
  }
  return os->str();
}